

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubDHeap::AllocateVertexAndSetId(ON_SubDHeap *this,uint candidate_vertex_id)

{
  ON_SubDVertex *pOVar1;
  ON_SubDComponentBase *c;
  ON_SubDComponentBase *unused_list;
  ON_SubDHeap *pOStack_10;
  uint candidate_vertex_id_local;
  ON_SubDHeap *this_local;
  
  c = &this->m_unused_vertex->super_ON_SubDComponentBase;
  unused_list._4_4_ = candidate_vertex_id;
  pOStack_10 = this;
  pOVar1 = (ON_SubDVertex *)
           Internal_AllocateComponentAndSetId
                     (&this->m_fspv,&c,&this->m_max_vertex_id,candidate_vertex_id);
  this->m_unused_vertex = (ON_SubDVertex *)c;
  return pOVar1;
}

Assistant:

class ON_SubDVertex* ON_SubDHeap::AllocateVertexAndSetId(unsigned int candidate_vertex_id)
{
  ON_SubDComponentBase* unused_list = m_unused_vertex;
  ON_SubDComponentBase* c = ON_SubDHeap::Internal_AllocateComponentAndSetId(
    m_fspv,
    unused_list,
    m_max_vertex_id,
    candidate_vertex_id
  );
  m_unused_vertex = static_cast<ON_SubDVertex*>(unused_list);
  return static_cast<ON_SubDVertex*>(c);
}